

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariationIndex.cpp
# Opt level: O0

unique_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
 __thiscall
VariationIndex::_containedIn(VariationIndex *this,int chromosome_id,size_t start,size_t end)

{
  event_type_t eVar1;
  ulong uVar2;
  bool bVar3;
  size_type sVar4;
  const_reference pvVar5;
  void *__s;
  pointer pvVar6;
  ulong in_RCX;
  long in_RSI;
  __uniq_ptr_data<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_true,_true>
  in_RDI;
  ulong in_R8;
  pair<boost::unordered::iterator_detail::c_iterator<boost::unordered::detail::ptr_node<unsigned_long>_>,_bool>
  pVar7;
  event_t *event;
  size_t i;
  unordered_set<unsigned_long,_boost::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  active_variations;
  vector<VariationIndex::event_t,_std::allocator<VariationIndex::event_t>_> *event_list;
  size_t k;
  chromosome_record_t *chromosome_record;
  unique_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *result;
  unordered_map<int,_VariationIndex::chromosome_record_t,_boost::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_VariationIndex::chromosome_record_t>_>_>
  *in_stack_fffffffffffffeb8;
  unique_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *in_stack_fffffffffffffec0;
  const_iterator in_stack_fffffffffffffec8;
  undefined7 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed7;
  key_type *in_stack_fffffffffffffed8;
  unordered_map<int,_VariationIndex::chromosome_record_t,_boost::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_VariationIndex::chromosome_record_t>_>_>
  *in_stack_fffffffffffffee0;
  c_iterator<boost::unordered::detail::ptr_node<unsigned_long>_> local_d8;
  c_iterator<boost::unordered::detail::ptr_node<unsigned_long>_> local_d0;
  node_pointer local_c8;
  undefined1 local_c0;
  const_reference local_b0;
  ulong local_a8;
  mapped_type *local_70;
  ulong local_68;
  mapped_type *local_60;
  undefined4 local_54;
  iterator<boost::unordered::detail::ptr_node<std::pair<const_int,_VariationIndex::chromosome_record_t>_>_>
  local_50 [3];
  iterator<boost::unordered::detail::ptr_node<std::pair<const_int,_VariationIndex::chromosome_record_t>_>_>
  local_38;
  byte local_29;
  ulong local_28;
  ulong local_20;
  
  local_29 = 0;
  local_28 = in_R8;
  local_20 = in_RCX;
  std::
  unique_ptr<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::default_delete<std::vector<unsigned_long,std::allocator<unsigned_long>>>>
  ::unique_ptr<std::default_delete<std::vector<unsigned_long,std::allocator<unsigned_long>>>,void>
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  local_38.node_ =
       (node_pointer)
       boost::unordered::
       unordered_map<int,_VariationIndex::chromosome_record_t,_boost::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_VariationIndex::chromosome_record_t>_>_>
       ::find(in_stack_fffffffffffffeb8,(key_type *)0x2a462f);
  local_50[0].node_ =
       (node_pointer)
       boost::unordered::
       unordered_map<int,_VariationIndex::chromosome_record_t,_boost::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_VariationIndex::chromosome_record_t>_>_>
       ::end(in_stack_fffffffffffffeb8);
  bVar3 = boost::unordered::iterator_detail::
          iterator<boost::unordered::detail::ptr_node<std::pair<const_int,_VariationIndex::chromosome_record_t>_>_>
          ::operator==(&local_38,local_50);
  if (bVar3) {
    local_29 = 1;
    local_54 = 1;
  }
  else {
    local_60 = boost::unordered::
               unordered_map<int,_VariationIndex::chromosome_record_t,_boost::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_VariationIndex::chromosome_record_t>_>_>
               ::operator[](in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    local_68 = (local_20 - 1) / *(ulong *)(in_RSI + 0x78);
    sVar4 = std::vector<VariationIndex::checkpoint_t,_std::allocator<VariationIndex::checkpoint_t>_>
            ::size(&local_60->checkpoint_list);
    if (local_68 < sVar4) {
      local_70 = local_60;
      boost::unordered::
      unordered_set<unsigned_long,_boost::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
      ::unordered_set((unordered_set<unsigned_long,_boost::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                       *)in_stack_fffffffffffffee0);
      pvVar5 = std::
               vector<VariationIndex::checkpoint_t,_std::allocator<VariationIndex::checkpoint_t>_>::
               operator[](&local_60->checkpoint_list,local_68);
      for (local_a8 = pvVar5->index; uVar2 = local_a8,
          sVar4 = std::vector<VariationIndex::event_t,_std::allocator<VariationIndex::event_t>_>::
                  size(&local_70->events), uVar2 < sVar4; local_a8 = local_a8 + 1) {
        local_b0 = std::vector<VariationIndex::event_t,_std::allocator<VariationIndex::event_t>_>::
                   operator[](&local_70->events,local_a8);
        if (local_20 <= local_b0->position) {
          if (local_28 < local_b0->position) break;
          eVar1 = local_b0->type;
          if (eVar1 == INSERTION) {
            pvVar6 = std::
                     unique_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                     ::get(in_stack_fffffffffffffec0);
            if (pvVar6 == (pointer)0x0) {
              __s = operator_new(0x18);
              memset(__s,0,0x18);
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x2a4856);
              std::
              unique_ptr<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::default_delete<std::vector<unsigned_long,std::allocator<unsigned_long>>>>
              ::
              unique_ptr<std::default_delete<std::vector<unsigned_long,std::allocator<unsigned_long>>>,void>
                        (in_stack_fffffffffffffec0,(pointer)in_stack_fffffffffffffeb8);
              std::
              unique_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              ::operator=(in_stack_fffffffffffffec0,
                          (unique_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                           *)in_stack_fffffffffffffeb8);
              std::
              unique_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              ::~unique_ptr(in_stack_fffffffffffffec0);
            }
            std::
            unique_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            ::operator->((unique_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                          *)0x2a48b9);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
                       (value_type_conflict3 *)in_stack_fffffffffffffec8.node_);
          }
          else if (eVar1 == DELETION_START) {
            pVar7 = boost::unordered::
                    unordered_set<unsigned_long,_boost::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                    ::insert((unordered_set<unsigned_long,_boost::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                              *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
                             (value_type_conflict3 *)in_stack_fffffffffffffec8.node_);
            local_c8 = (node_pointer)pVar7.first.node_;
            in_stack_fffffffffffffed7 = pVar7.second;
            local_c0 = in_stack_fffffffffffffed7;
          }
          else if (eVar1 == DELETION_END) {
            in_stack_fffffffffffffec8 =
                 boost::unordered::
                 unordered_set<unsigned_long,_boost::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                 ::find((unordered_set<unsigned_long,_boost::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                         *)in_stack_fffffffffffffeb8,(key_type_conflict1 *)0x2a492e);
            local_d0.node_ = in_stack_fffffffffffffec8.node_;
            local_d8.node_ =
                 (node_pointer)
                 boost::unordered::
                 unordered_set<unsigned_long,_boost::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                 ::end((unordered_set<unsigned_long,_boost::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                        *)in_stack_fffffffffffffeb8);
            bVar3 = boost::unordered::iterator_detail::operator!=(&local_d0,&local_d8);
            if (bVar3) {
              pvVar6 = std::
                       unique_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       ::get(in_stack_fffffffffffffec0);
              if (pvVar6 == (pointer)0x0) {
                in_stack_fffffffffffffec0 =
                     (unique_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      *)operator_new(0x18);
                memset(in_stack_fffffffffffffec0,0,0x18);
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x2a49a5);
                std::
                unique_ptr<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::default_delete<std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                ::
                unique_ptr<std::default_delete<std::vector<unsigned_long,std::allocator<unsigned_long>>>,void>
                          (in_stack_fffffffffffffec0,(pointer)in_stack_fffffffffffffeb8);
                std::
                unique_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ::operator=(in_stack_fffffffffffffec0,
                            (unique_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                             *)in_stack_fffffffffffffeb8);
                std::
                unique_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ::~unique_ptr(in_stack_fffffffffffffec0);
              }
              std::
              unique_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              ::operator->((unique_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                            *)0x2a49d7);
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
                         (value_type_conflict3 *)in_stack_fffffffffffffec8.node_);
            }
          }
        }
      }
      local_29 = 1;
      local_54 = 1;
      boost::unordered::
      unordered_set<unsigned_long,_boost::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
      ::~unordered_set((unordered_set<unsigned_long,_boost::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                        *)0x2a4a2e);
    }
    else {
      local_29 = 1;
      local_54 = 1;
    }
  }
  if ((local_29 & 1) == 0) {
    std::
    unique_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::~unique_ptr(in_stack_fffffffffffffec0);
  }
  return (__uniq_ptr_data<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_true,_true>
          )(tuple<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            )in_RDI.
             super___uniq_ptr_impl<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             .
             super__Head_base<0UL,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_false>
             ._M_head_impl;
}

Assistant:

unique_ptr<vector<size_t> > VariationIndex::_containedIn(int chromosome_id, size_t start, size_t end) {
	unique_ptr<vector<size_t> > result(nullptr);
	if (chromosomes.find(chromosome_id) == chromosomes.end()) {
		return result;
	}
	const chromosome_record_t& chromosome_record = chromosomes[chromosome_id];
	size_t k = (start-1) / step_size;
	if (chromosome_record.checkpoint_list.size() <= k) {
		return result;
	}
	const vector<event_t>& event_list = chromosome_record.events;
	boost::unordered_set<size_t> active_variations;
	for (size_t i=chromosome_record.checkpoint_list[k].index; i<event_list.size(); ++i) {
		const event_t& event = event_list[i];
		if (event.position < start) continue;
		if (event.position > end) break;
		switch (event.type) {
		case INSERTION:
			if (result.get() == 0) {
				result = unique_ptr<vector<size_t> >(new vector<size_t>());
			}
			result->push_back(event.variation_index);
			break;
		case DELETION_START:
			active_variations.insert(event.variation_index);
			break;
		case DELETION_END:
			if (active_variations.find(event.variation_index) != active_variations.end()) {
				if (result.get() == 0) {
					result = unique_ptr<vector<size_t> >(new vector<size_t>());
				}
				result->push_back(event.variation_index);
			}
			break;
		default:
			assert(false);
			break;
		}
	}
	return result;
}